

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int print_lda(char *fn)

{
  int32 iVar1;
  FILE *fp;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint32 n;
  uint32 m;
  uint32 n_lda;
  uint32 swap;
  float32 ***lda;
  uint32 chksum;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0x88,"Reading %s\n",fn);
  fp = s3open(fn,"rb",&swap);
  iVar2 = -1;
  if (fp != (FILE *)0x0) {
    iVar1 = bio_fread_3d(&lda,4,&n_lda,&m,&n,fp,swap,&chksum);
    if (-1 < iVar1) {
      printf("lda %u %u %u\n",(ulong)n_lda,(ulong)m,(ulong)n);
      for (uVar4 = 0; uVar4 < n_lda; uVar4 = uVar4 + 1) {
        printf("lda %u\n",uVar4 & 0xffffffff);
        for (uVar5 = 0; uVar5 < m; uVar5 = uVar5 + 1) {
          for (uVar3 = 0; uVar3 < n; uVar3 = uVar3 + 1) {
            printf("%e ",(double)(float)lda[uVar4][uVar5][uVar3]);
          }
          putchar(10);
        }
        putchar(10);
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
print_lda(const char *fn)
{
    FILE *fh;
    float32 ***lda;
    uint32 n_lda, m, n;
    uint32 i, j, k, swap, chksum;

    E_INFO("Reading %s\n",  fn);
    
    if ((fh = s3open(fn, "rb", &swap)) == NULL)
	return S3_ERROR;
    if (bio_fread_3d((void ****)&lda, sizeof(float32),
		  &n_lda, &m, &n, fh, swap, &chksum) < 0)
	return S3_ERROR;

    printf("lda %u %u %u\n", n_lda, m, n);

    for (i = 0; i < n_lda; i++) {
	printf("lda %u\n", i);
	for (j = 0; j < m; j++) {
	    for (k = 0; k < n; k++) {
		printf("%e ", lda[i][j][k]);
	    }
	    printf("\n");
	}
	printf("\n");
    }
    return S3_SUCCESS;
}